

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateStaticVariablesInitialization
          (ExtensionGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  FieldDescriptor *pFVar3;
  bool bVar4;
  ObjectiveCType OVar5;
  EnumDescriptor *this_00;
  Descriptor *this_01;
  Nonnull<const_char_*> pcVar6;
  undefined8 in_RCX;
  undefined8 uVar7;
  AlphaNum *pAVar8;
  Descriptor *in_RDX;
  undefined8 extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  EnumDescriptor *descriptor;
  FieldDescriptor *field_01;
  Descriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_00;
  long lVar9;
  string_view class_name;
  string_view class_name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string containing_type;
  anon_class_1_0_00000001 local_ae9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  int local_944;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  undefined8 local_820;
  char *local_818 [2];
  long alStack_808 [2];
  undefined1 auStack_7f8 [8];
  AlphaNum *local_7f0;
  Nonnull<std::unique_ptr<LogMessageData>_> local_7e8;
  byte abStack_7d8 [8];
  AlphaNum *apAStack_7d0 [2];
  undefined1 local_7c0 [48];
  AlphaNum local_790;
  Sub local_760;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  ClassName_abi_cxx11_(&local_8c0,(objectivec *)this->descriptor_->containing_type_,in_RDX);
  OVar5 = GetObjectiveCType((uint)this->descriptor_->type_);
  local_ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = this->descriptor_;
  bVar2 = pFVar3->field_0x1;
  uVar7 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
  bVar4 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar4) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar4,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar6);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_760);
  }
  if ((pFVar3->field_0x1 & 0x20) != 0) {
    paVar1 = &local_760.key_.field_2;
    local_760.key_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"GPBExtensionRepeated","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_ae8,
               &local_760.key_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_760.key_._M_dataplus._M_p,
                      local_760.key_.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar4) {
    paVar1 = &local_760.key_.field_2;
    local_760.key_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"GPBExtensionPacked","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_ae8,
               &local_760.key_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_760.key_._M_dataplus._M_p,
                      local_760.key_.field_2._M_allocated_capacity + 1);
    }
  }
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"default","");
  pFVar3 = this->descriptor_;
  bVar2 = pFVar3->field_0x1;
  pAVar8 = (AlphaNum *)CONCAT71((int7)((ulong)uVar7 >> 8),bVar2);
  field = (FieldDescriptor *)CONCAT71((int7)((ulong)extraout_RDX >> 8),0xbf < bVar2);
  bVar4 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar4) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar4,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    field = extraout_RDX_00;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if ((pFVar3->field_0x1 & 0x20) == 0) {
      DefaultValue_abi_cxx11_(&local_968,(objectivec *)this->descriptor_,field);
    }
    else {
      local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"nil","");
    }
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_760,&local_9c8,&local_968);
    local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"default_name","");
    GPBGenericValueFieldName_abi_cxx11_(&local_840,(objectivec *)this->descriptor_,field_00);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_6a8,&local_9e8,&local_840);
    local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"enum_desc_func_name","");
    if (OVar5 == OBJECTIVECTYPE_ENUM) {
      this_00 = FieldDescriptor::enum_type(this->descriptor_);
      EnumName_abi_cxx11_(&local_8e0,(objectivec *)this_00,descriptor);
      local_7f0 = (AlphaNum *)local_8e0._M_string_length;
      local_7e8._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )local_8e0._M_dataplus._M_p;
      local_790.piece_._M_len = 0xf;
      local_790.piece_._M_str = "_EnumDescriptor";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_988,(lts_20250127 *)&local_7f0,&local_790,
                 (AlphaNum *)local_8e0._M_string_length);
      pAVar8 = (AlphaNum *)local_8e0._M_string_length;
    }
    else {
      local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"NULL","");
    }
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_5f0,&local_a08,&local_988);
    local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"extended_type","");
    class_name._M_str = (char *)pAVar8;
    class_name._M_len = (size_t)local_8c0._M_dataplus._M_p;
    ObjCClass_abi_cxx11_(&local_860,(objectivec *)local_8c0._M_string_length,class_name);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_538,&local_a28,&local_860);
    local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"extension_type","");
    local_820 = 0xb;
    local_818[0] = "GPBDataType";
    GetCapitalizedType_abi_cxx11_(&local_900,(objectivec *)this->descriptor_,field_01);
    local_7c0._0_8_ = local_900._M_string_length;
    local_7c0._8_8_ = local_900._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_880,(lts_20250127 *)&local_820,(AlphaNum *)local_7c0,
               (AlphaNum *)local_900._M_string_length);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_480,&local_a48,&local_880);
    local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,"method_name","");
    io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_a68,&this->method_name_);
    local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"number","");
    local_944 = this->descriptor_->number_;
    io::Printer::Sub::Sub<int>(&local_310,&local_a88,&local_944);
    local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"options","");
    BuildFlagsString(&local_8a0,FLAGTYPE_EXTENSION,&local_ae8);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_aa8,&local_8a0);
    local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ac8,"root_or_message_class_name","");
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (&local_1a0,&local_ac8,&this->root_or_message_class_name_);
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"type","");
    if (OVar5 == OBJECTIVECTYPE_MESSAGE) {
      this_01 = FieldDescriptor::message_type(this->descriptor_);
      ClassName_abi_cxx11_(&local_940,(objectivec *)this_01,descriptor_00);
      class_name_00._M_str = (char *)local_900._M_string_length;
      class_name_00._M_len = (size_t)local_940._M_dataplus._M_p;
      ObjCClass_abi_cxx11_(&local_9a8,(objectivec *)local_940._M_string_length,class_name_00);
    }
    else {
      local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"Nil","");
    }
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,&local_920,&local_9a8);
    io::Printer::Emit(printer,&local_760,10,0x1b1,
                      "\n        {\n          .defaultValue.$default_name$ = $default$,\n          .singletonName = GPBStringifySymbol($root_or_message_class_name$) \"_$method_name$\",\n          .extendedClass.clazz = $extended_type$,\n          .messageOrGroupClass.clazz = $type$,\n          .enumDescriptorFunc = $enum_desc_func_name$,\n          .fieldNumber = $number$,\n          .dataType = $extension_type$,\n          .options = $options$,\n        },\n      "
                     );
    lVar9 = 0x730;
    do {
      if (local_790.digits_[lVar9 + 0x18] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_7c0 + lVar9 + 0x18));
      }
      if ((long *)(local_7c0 + lVar9) != *(long **)((long)apAStack_7d0 + lVar9)) {
        operator_delete(*(long **)((long)apAStack_7d0 + lVar9),*(long *)(local_7c0 + lVar9) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[abStack_7d8[lVar9]]._M_data)
                (&local_ae9,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(auStack_7f8 + lVar9));
      abStack_7d8[lVar9] = 0xff;
      if ((long *)((long)alStack_808 + lVar9) != *(long **)((long)local_818 + lVar9)) {
        operator_delete(*(long **)((long)local_818 + lVar9),*(long *)((long)alStack_808 + lVar9) + 1
                       );
      }
      lVar9 = lVar9 + -0xb8;
    } while (lVar9 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    if ((OVar5 == OBJECTIVECTYPE_MESSAGE) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2)) {
      operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
      operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
      operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
      operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
      operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
      operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
      operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_988._M_dataplus._M_p != &local_988.field_2) {
      operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
    }
    if ((OVar5 == OBJECTIVECTYPE_ENUM) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2)) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
      operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
      operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_968._M_dataplus._M_p != &local_968.field_2) {
      operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
      operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ae8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
      operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_7f0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar6);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7f0)
  ;
}

Assistant:

void ExtensionGenerator::GenerateStaticVariablesInitialization(
    io::Printer* printer) const {
  const std::string containing_type = ClassName(descriptor_->containing_type());
  ObjectiveCType objc_type = GetObjectiveCType(descriptor_);

  std::vector<std::string> options;
  if (descriptor_->is_repeated()) options.push_back("GPBExtensionRepeated");
  if (descriptor_->is_packed()) options.push_back("GPBExtensionPacked");

  printer->Emit(
      {{"default",
        descriptor_->is_repeated() ? "nil" : DefaultValue(descriptor_)},
       {"default_name", GPBGenericValueFieldName(descriptor_)},
       {"enum_desc_func_name",
        objc_type == OBJECTIVECTYPE_ENUM
            ? absl::StrCat(EnumName(descriptor_->enum_type()),
                           "_EnumDescriptor")
            : "NULL"},
       {"extended_type", ObjCClass(containing_type)},
       {"extension_type",
        absl::StrCat("GPBDataType", GetCapitalizedType(descriptor_))},
       {"method_name", method_name_},
       {"number", descriptor_->number()},
       {"options", BuildFlagsString(FLAGTYPE_EXTENSION, options)},
       {"root_or_message_class_name", root_or_message_class_name_},
       {"type", objc_type == OBJECTIVECTYPE_MESSAGE
                    ? ObjCClass(ClassName(descriptor_->message_type()))
                    : "Nil"}},
      R"objc(
        {
          .defaultValue.$default_name$ = $default$,
          .singletonName = GPBStringifySymbol($root_or_message_class_name$) "_$method_name$",
          .extendedClass.clazz = $extended_type$,
          .messageOrGroupClass.clazz = $type$,
          .enumDescriptorFunc = $enum_desc_func_name$,
          .fieldNumber = $number$,
          .dataType = $extension_type$,
          .options = $options$,
        },
      )objc");
}